

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BinsSelectionSyntax *pBVar1;
  Token TVar2;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000028;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000030;
  Token *in_stack_00000038;
  BumpAllocator *in_stack_000000c8;
  Token *in_stack_000000d0;
  BumpAllocator *in_stack_ffffffffffffff78;
  CoverageIffClauseSyntax *in_stack_ffffffffffffff80;
  Info *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000030,in_stack_00000028);
  TVar2 = parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  args_4 = TVar2.info;
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  not_null<slang::syntax::BinsSelectExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)0xa5087d);
  deepClone<slang::syntax::BinsSelectExpressionSyntax>
            ((BinsSelectExpressionSyntax *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  if (((Token *)((long)__fn + 0x80))->info != (Info *)0x0) {
    deepClone<slang::syntax::CoverageIffClauseSyntax>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  parsing::Token::deepClone(in_stack_000000d0,in_stack_000000c8);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinsSelectionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::BinsSelectExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (Token *)__child_stack,(BinsSelectExpressionSyntax *)args_4,
                      (CoverageIffClauseSyntax **)in_stack_00000030,in_stack_00000038);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinsSelectionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinsSelectionSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<BinsSelectExpressionSyntax>(*node.expr, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.semi.deepClone(alloc)
    );
}